

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::FixedFieldWithIDAndReason::readFrom
          (FixedFieldWithIDAndReason *this,uint8 *buffer,uint32 bufLength)

{
  uint8 uVar1;
  uint16 uVar2;
  uint32 bufLength_local;
  uint8 *buffer_local;
  FixedFieldWithIDAndReason *this_local;
  
  if (bufLength < 2) {
    this_local._4_4_ = 0xfffffffe;
  }
  else {
    uVar1 = buffer[1];
    (this->super_FixedFieldWithRemainingLength).field_0x14 = buffer[0];
    (this->super_FixedFieldWithRemainingLength).field_0x15 = uVar1;
    uVar2 = BigEndian(*(uint16 *)&(this->super_FixedFieldWithRemainingLength).field_0x14);
    *(uint16 *)&(this->super_FixedFieldWithRemainingLength).field_0x14 = uVar2;
    if ((this->super_FixedFieldWithRemainingLength).remLength == 2) {
      this_local._4_4_ = 0xfffffffd;
    }
    else {
      ((this->_v).value)->reasonCode = buffer[2];
      if ((this->super_FixedFieldWithRemainingLength).remLength == 3) {
        this_local._4_4_ = 0xfffffffd;
      }
      else {
        this_local._4_4_ = 3;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    memcpy(&packetID, buffer, sizeof(packetID)); packetID = BigEndian(packetID);
                    if (remLength == 2) return Shortcut;
                    _v.value.reasonCode = buffer[2];
                    if (remLength == 3) return Shortcut; // No need to read properties here
                    return 3;
                }